

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O0

wchar_t strncat_from_utf8_libarchive2
                  (archive_string *as,void *_p,size_t len,archive_string_conv *sc)

{
  long lVar1;
  long lVar2;
  archive_string *paVar3;
  size_t s_00;
  size_t sVar4;
  size_t in_RDX;
  char *in_RSI;
  long *in_RDI;
  wchar_t wc;
  mbstate_t shift_state;
  uint32_t unicode;
  char *end;
  char *p;
  wchar_t n;
  char *s;
  size_t in_stack_ffffffffffffffa0;
  wchar_t in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  wchar_t local_4c;
  char *local_48;
  char *local_40;
  wchar_t local_34;
  char *local_30;
  size_t local_20;
  char *local_18;
  long *local_10;
  wchar_t local_4;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  memset(&stack0xffffffffffffffac,0,8);
  paVar3 = archive_string_ensure
                     ((archive_string *)
                      CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                      in_stack_ffffffffffffffa0);
  if (paVar3 == (archive_string *)0x0) {
    local_4 = L'\xffffffff';
  }
  else {
    local_30 = local_18;
    local_40 = (char *)(*local_10 + local_10[1]);
    s_00 = *local_10 + local_10[2];
    sVar4 = __ctype_get_mb_cur_max();
    local_48 = (char *)((s_00 - sVar4) - 1);
    while (local_34 = _utf8_to_unicode((uint32_t *)&local_4c,local_30,local_20), local_34 != L'\0')
    {
      if (local_48 <= local_40) {
        local_10[1] = (long)local_40 - *local_10;
        paVar3 = archive_string_ensure
                           ((archive_string *)
                            CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),s_00);
        if (paVar3 == (archive_string *)0x0) {
          return L'\xffffffff';
        }
        local_40 = (char *)(*local_10 + local_10[1]);
        lVar1 = *local_10;
        lVar2 = local_10[2];
        sVar4 = __ctype_get_mb_cur_max();
        local_48 = (char *)(((lVar1 + lVar2) - sVar4) - 1);
      }
      in_stack_ffffffffffffffa8 = local_4c;
      if (local_34 < L'\0') {
        local_34 = -local_34;
        in_stack_ffffffffffffffa8 = L'?';
      }
      local_30 = local_30 + local_34;
      local_20 = local_20 - (long)local_34;
      sVar4 = wcrtomb(local_40,in_stack_ffffffffffffffa8,(mbstate_t *)&stack0xffffffffffffffac);
      local_34 = (wchar_t)sVar4;
      if (local_34 == -1) {
        return L'\xffffffff';
      }
      local_40 = local_40 + local_34;
    }
    local_10[1] = (long)local_40 - *local_10;
    *(undefined1 *)(*local_10 + local_10[1]) = 0;
    local_4 = L'\0';
  }
  return local_4;
}

Assistant:

static int
strncat_from_utf8_libarchive2(struct archive_string *as,
    const void *_p, size_t len, struct archive_string_conv *sc)
{
	const char *s;
	int n;
	char *p;
	char *end;
	uint32_t unicode;
#if HAVE_WCRTOMB
	mbstate_t shift_state;

	memset(&shift_state, 0, sizeof(shift_state));
#else
	/* Clear the shift state before starting. */
	wctomb(NULL, L'\0');
#endif
	(void)sc; /* UNUSED */
	/*
	 * Allocate buffer for MBS.
	 * We need this allocation here since it is possible that
	 * as->s is still NULL.
	 */
	if (archive_string_ensure(as, as->length + len + 1) == NULL)
		return (-1);

	s = (const char *)_p;
	p = as->s + as->length;
	end = as->s + as->buffer_length - MB_CUR_MAX -1;
	while ((n = _utf8_to_unicode(&unicode, s, len)) != 0) {
		wchar_t wc;

		if (p >= end) {
			as->length = p - as->s;
			/* Re-allocate buffer for MBS. */
			if (archive_string_ensure(as,
			    as->length + len * 2 + 1) == NULL)
				return (-1);
			p = as->s + as->length;
			end = as->s + as->buffer_length - MB_CUR_MAX -1;
		}

		/*
		 * As libarchie 2.x, translates the UTF-8 characters into
		 * wide-characters in the assumption that WCS is Unicode.
		 */
		if (n < 0) {
			n *= -1;
			wc = L'?';
		} else
			wc = (wchar_t)unicode;

		s += n;
		len -= n;
		/*
		 * Translates the wide-character into the current locale MBS.
		 */
#if HAVE_WCRTOMB
		n = (int)wcrtomb(p, wc, &shift_state);
#else
		n = (int)wctomb(p, wc);
#endif
		if (n == -1)
			return (-1);
		p += n;
	}
	as->length = p - as->s;
	as->s[as->length] = '\0';
	return (0);
}